

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::ExpandTestsToRunInformationForRerunFailed(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  char *pcVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  unsigned_long dindex;
  Directory directory;
  int val;
  string lastTestsFailedLog;
  char *local_430 [4];
  string logName;
  string dirName;
  string pattern;
  string fileNameSubstring;
  ifstream ifs;
  byte abStack_218 [488];
  
  cmCTest::GetBinaryDir_abi_cxx11_((string *)&ifs,(this->super_cmCTestGenericHandler).CTest);
  std::operator+(&dirName,(string *)&ifs,"/Testing/Temporary");
  std::__cxx11::string::~string((string *)&ifs);
  cmsys::Directory::Directory(&directory);
  bVar2 = cmsys::Directory::Load(&directory,&dirName);
  if (bVar2) {
    uVar4 = cmsys::Directory::GetNumberOfFilesInDirectory(&dirName);
    std::__cxx11::string::string((string *)&pattern,"LastTestsFailed",(allocator *)&ifs);
    std::__cxx11::string::string((string *)&logName,"",(allocator *)&ifs);
    dindex = 0;
    uVar8 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar8 = dindex;
    }
    for (; uVar8 != dindex; dindex = dindex + 1) {
      pcVar5 = cmsys::Directory::GetFile(&directory,dindex);
      std::__cxx11::string::string((string *)&ifs,pcVar5,(allocator *)&fileNameSubstring);
      std::__cxx11::string::substr((ulong)&fileNameSubstring,(ulong)&ifs);
      iVar3 = std::__cxx11::string::compare((string *)&fileNameSubstring);
      if (iVar3 == 0) {
        bVar2 = std::operator==(&logName,"");
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)&logName);
        }
        else {
          cmsys::SystemTools::FileTimeCompare(&logName,(string *)&ifs,(int *)&lastTestsFailedLog);
          if ((int)lastTestsFailedLog._M_dataplus._M_p == -1) {
            std::__cxx11::string::_M_assign((string *)&logName);
          }
        }
      }
      std::__cxx11::string::~string((string *)&fileNameSubstring);
      std::__cxx11::string::~string((string *)&ifs);
    }
    cmCTest::GetBinaryDir_abi_cxx11_(&fileNameSubstring,(this->super_cmCTestGenericHandler).CTest);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs,
                   &fileNameSubstring,"/Testing/Temporary/");
    std::operator+(&lastTestsFailedLog,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs,
                   &logName);
    std::__cxx11::string::~string((string *)&ifs);
    std::__cxx11::string::~string((string *)&fileNameSubstring);
    bVar2 = cmsys::SystemTools::FileExists
                      ((char *)CONCAT44(lastTestsFailedLog._M_dataplus._M_p._4_4_,
                                        (int)lastTestsFailedLog._M_dataplus._M_p));
    if (bVar2) {
      std::ifstream::ifstream
                (&ifs,(char *)CONCAT44(lastTestsFailedLog._M_dataplus._M_p._4_4_,
                                       (int)lastTestsFailedLog._M_dataplus._M_p),_S_in);
      if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
        fileNameSubstring._M_dataplus._M_p = (pointer)&fileNameSubstring.field_2;
        fileNameSubstring._M_string_length = 0;
        fileNameSubstring.field_2._M_local_buf[0] = '\0';
        while( true ) {
          bVar2 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&ifs,&fileNameSubstring,(bool *)0x0,-1);
          if (!bVar2) break;
          lVar7 = std::__cxx11::string::find((char)&fileNameSubstring,0x3a);
          if (lVar7 != -1) {
            std::__cxx11::string::substr((ulong)local_430,(ulong)&fileNameSubstring);
            iVar3 = atoi(local_430[0]);
            std::__cxx11::string::~string((string *)local_430);
            val = iVar3;
            std::vector<int,_std::allocator<int>_>::push_back(&this->TestsToRun,&val);
          }
        }
        std::ifstream::close();
        std::__cxx11::string::~string((string *)&fileNameSubstring);
      }
      else {
        bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if ((!bVar2) && (((this->super_cmCTestGenericHandler).CTest)->PrintLabels == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fileNameSubstring);
          poVar6 = std::operator<<((ostream *)&fileNameSubstring,"Problem reading file: ");
          poVar6 = std::operator<<(poVar6,(string *)&lastTestsFailedLog);
          poVar6 = std::operator<<(poVar6," while generating list of previously failed tests.");
          std::endl<char,std::char_traits<char>>(poVar6);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x71b,local_430[0],false);
          std::__cxx11::string::~string((string *)local_430);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fileNameSubstring);
        }
      }
      std::ifstream::~ifstream(&ifs);
    }
    else {
      bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
      if ((!bVar2) && (((this->super_cmCTestGenericHandler).CTest)->PrintLabels == false)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar6 = std::operator<<((ostream *)&ifs,(string *)&lastTestsFailedLog);
        poVar6 = std::operator<<(poVar6," does not exist!");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x6ff,fileNameSubstring._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&fileNameSubstring);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      }
    }
    std::__cxx11::string::~string((string *)&lastTestsFailedLog);
    std::__cxx11::string::~string((string *)&logName);
    std::__cxx11::string::~string((string *)&pattern);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar6 = std::operator<<((ostream *)&ifs,"Unable to read the contents of ");
    poVar6 = std::operator<<(poVar6,(string *)&dirName);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x6d3,fileNameSubstring._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&fileNameSubstring);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
  }
  cmsys::Directory::~Directory(&directory);
  std::__cxx11::string::~string((string *)&dirName);
  return;
}

Assistant:

void cmCTestTestHandler::ExpandTestsToRunInformationForRerunFailed()
{

  std::string dirName = this->CTest->GetBinaryDir() + "/Testing/Temporary";

  cmsys::Directory directory;
  if (directory.Load(dirName) == 0)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to read the contents of "
      << dirName << std::endl);
    return;
    }

  int numFiles = static_cast<int>
    (cmsys::Directory::GetNumberOfFilesInDirectory(dirName));
  std::string pattern = "LastTestsFailed";
  std::string logName = "";

  for (int i = 0; i < numFiles; ++i)
    {
    std::string fileName = directory.GetFile(i);
    // bcc crashes if we attempt a normal substring comparison,
    // hence the following workaround
    std::string fileNameSubstring = fileName.substr(0, pattern.length());
    if (fileNameSubstring.compare(pattern) != 0)
      {
      continue;
      }
    if (logName == "")
      {
      logName = fileName;
      }
    else
      {
      // if multiple matching logs were found we use the most recently
      // modified one.
      int res;
      cmSystemTools::FileTimeCompare(logName, fileName, &res);
      if (res == -1)
        {
        logName = fileName;
        }
      }
    }

  std::string lastTestsFailedLog = this->CTest->GetBinaryDir()
    + "/Testing/Temporary/" + logName;

  if ( !cmSystemTools::FileExists(lastTestsFailedLog.c_str()) )
    {
    if ( !this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels() )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, lastTestsFailedLog
        << " does not exist!" << std::endl);
      }
    return;
    }

  // parse the list of tests to rerun from LastTestsFailed.log
  cmsys::ifstream ifs(lastTestsFailedLog.c_str());
  if ( ifs )
    {
    std::string line;
    std::string::size_type pos;
    while ( cmSystemTools::GetLineFromStream(ifs, line) )
      {
      pos = line.find(':', 0);
      if (pos == line.npos)
        {
        continue;
        }

      int val = atoi(line.substr(0, pos).c_str());
      this->TestsToRun.push_back(val);
      }
    ifs.close();
    }
  else if ( !this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels() )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Problem reading file: "
      << lastTestsFailedLog <<
      " while generating list of previously failed tests." << std::endl);
    }
}